

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.hpp
# Opt level: O3

OStreamer * __thiscall LiteScript::OStreamer::operator<<(OStreamer *this,uint *v)

{
  uint uVar1;
  ostream *poVar2;
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  
  poVar2 = this->stream;
  uVar1 = *v;
  local_1b = (char)uVar1;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b,1);
  local_1c = (char)(uVar1 >> 8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1c,1);
  local_1a = (char)(uVar1 >> 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a,1);
  local_19 = (char)(uVar1 >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_19,1);
  return this;
}

Assistant:

OStreamer& operator<<(const T& v) {
            Write<T>(this->stream, v);
            return *this;
        }